

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::ParsedScene::Shape(ParsedScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  FileLoc loc_00;
  FileLoc loc_01;
  bool bVar1;
  Transform *pTVar2;
  Transform *objectFromRender;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *this_00;
  ParameterDictionary *this_01;
  vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_> *this_02;
  ParameterDictionary dict;
  AnimatedTransform renderFromShape;
  int local_8dc;
  ParameterDictionary local_8b8;
  ParameterDictionary local_850;
  undefined1 local_7e8 [200];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_720;
  _Alloc_hider local_708;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f8;
  _Alloc_hider local_6e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d8 [37];
  _Alloc_hider local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  _Alloc_hider local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  _Alloc_hider local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  ParameterDictionary local_418;
  ParameterDictionary local_3b0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_348;
  memory_resource *local_2e8 [87];
  
  if (this->currentBlock != OptionsBlock) {
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector(&local_348,in_RDX);
    ParameterDictionary::ParameterDictionary
              (&local_850,&local_348,&(this->graphicsState).shapeAttributes,
               (this->graphicsState).colorSpace);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_348);
    if ((this->graphicsState).areaLightName._M_string_length == 0) {
      local_8dc = -1;
    }
    else {
      local_2e8[0] = pstd::pmr::new_delete_resource();
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::InlinedVector(&local_8b8.params,&(this->graphicsState).areaLightParams.params,
                      (polymorphic_allocator<pbrt::ParsedParameter_*> *)local_2e8);
      local_8b8.colorSpace = (this->graphicsState).areaLightParams.colorSpace;
      SceneEntity::SceneEntity
                ((SceneEntity *)local_7e8,&(this->graphicsState).areaLightName,&local_8b8,
                 (this->graphicsState).areaLightLoc);
      std::vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>::
      emplace_back<pbrt::SceneEntity>(&this->areaLights,(SceneEntity *)local_7e8);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                        *)(local_7e8 + 0x20));
      if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
        operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
      }
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::~InlinedVector(&local_8b8.params);
      local_8dc = (int)((ulong)((long)(this->areaLights).
                                      super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->areaLights).
                                     super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x33333333
                  + -1;
    }
    bVar1 = pbrt::Transform::operator!=((this->graphicsState).ctm.t,(this->graphicsState).ctm.t + 1)
    ;
    if (bVar1) {
      if (this->currentInstance == (InstanceDefinitionSceneEntity *)0x0) {
        this_02 = &this->animatedShapes;
      }
      else {
        if ((this->graphicsState).areaLightName._M_string_length != 0) {
          Warning((FileLoc *)&params,"Area lights not supported with object instancing");
        }
        this_02 = &this->currentInstance->animatedShapes;
      }
      RenderFromObject((AnimatedTransform *)local_2e8,this);
      local_7e8._64_8_ = (ParsedParameter *)0x0;
      local_7e8._72_8_ = (ParsedParameter *)0x0;
      local_7e8._80_8_ = (ParsedParameter *)0x0;
      local_7e8._88_8_ = (ParsedParameter *)0x0;
      local_7e8._96_8_ = (ParsedParameter *)0x0;
      local_7e8._104_8_ = (ParsedParameter *)0x0;
      local_7e8._112_8_ = 0;
      local_7e8._120_8_ = 0;
      local_7e8._0_8_ = (pointer)0x0;
      local_7e8._8_8_ = 0;
      local_7e8._16_8_ = 0;
      local_7e8._24_8_ = 0;
      local_7e8._32_8_ = (memory_resource *)0x0;
      local_7e8._40_8_ = (ParsedParameter **)0x0;
      local_7e8._48_8_ = (ParsedParameter *)0x0;
      local_7e8._56_8_ = (ParsedParameter *)0x0;
      pbrt::Transform::Transform((Transform *)local_7e8);
      pTVar2 = TransformCache::Lookup(&this->transformCache,(Transform *)local_7e8);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::InlinedVector(&local_3b0.params,&local_850.params);
      local_3b0.colorSpace = local_850.colorSpace;
      loc_00.filename._M_str = (char *)params.ptr;
      loc_00.filename._M_len = (size_t)params.alloc.memoryResource;
      loc_00._16_8_ = params.field_2.fixed[0];
      AnimatedShapeSceneEntity::AnimatedShapeSceneEntity
                ((AnimatedShapeSceneEntity *)local_7e8,name,&local_3b0,loc_00,
                 (AnimatedTransform *)local_2e8,pTVar2,(this->graphicsState).reverseOrientation,
                 (this->graphicsState).currentMaterialIndex,
                 &(this->graphicsState).currentMaterialName,local_8dc,
                 &(this->graphicsState).currentInsideMedium,
                 &(this->graphicsState).currentOutsideMedium);
      std::vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>::
      emplace_back<pbrt::AnimatedShapeSceneEntity>(this_02,(AnimatedShapeSceneEntity *)local_7e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_p != &local_428) {
        operator_delete(local_438._M_p,local_428._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_p != &local_448) {
        operator_delete(local_458._M_p,local_448._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_p != &local_470) {
        operator_delete(local_480._M_p,local_470._M_allocated_capacity + 1);
      }
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                        *)(local_7e8 + 0x20));
      if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
        operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
      }
      this_01 = &local_3b0;
    }
    else {
      if (this->currentInstance == (InstanceDefinitionSceneEntity *)0x0) {
        this_00 = &this->shapes;
      }
      else {
        if ((this->graphicsState).areaLightName._M_string_length != 0) {
          Warning((FileLoc *)&params,"Area lights not supported with object instancing");
        }
        this_00 = &this->currentInstance->shapes;
      }
      RenderFromObject((Transform *)local_7e8,this,0);
      pTVar2 = TransformCache::Lookup(&this->transformCache,(Transform *)local_7e8);
      local_7e8._0_8_ = *(undefined8 *)(pTVar2->mInv).m[0];
      local_7e8._8_8_ = *(undefined8 *)((pTVar2->mInv).m[0] + 2);
      local_7e8._16_8_ = *(undefined8 *)(pTVar2->mInv).m[1];
      local_7e8._24_8_ = *(undefined8 *)((pTVar2->mInv).m[1] + 2);
      local_7e8._32_8_ = *(undefined8 *)(pTVar2->mInv).m[2];
      local_7e8._40_8_ = *(undefined8 *)((pTVar2->mInv).m[2] + 2);
      local_7e8._48_8_ = *(undefined8 *)(pTVar2->mInv).m[3];
      local_7e8._56_8_ = *(undefined8 *)((pTVar2->mInv).m[3] + 2);
      local_7e8._64_8_ = *(undefined8 *)(pTVar2->m).m[0];
      local_7e8._72_8_ = *(undefined8 *)((pTVar2->m).m[0] + 2);
      local_7e8._80_8_ = *(undefined8 *)(pTVar2->m).m[1];
      local_7e8._88_8_ = *(undefined8 *)((pTVar2->m).m[1] + 2);
      local_7e8._96_8_ = *(undefined8 *)(pTVar2->m).m[2];
      local_7e8._104_8_ = *(undefined8 *)((pTVar2->m).m[2] + 2);
      local_7e8._112_8_ = *(undefined8 *)(pTVar2->m).m[3];
      local_7e8._120_8_ = *(undefined8 *)((pTVar2->m).m[3] + 2);
      objectFromRender = TransformCache::Lookup(&this->transformCache,(Transform *)local_7e8);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::InlinedVector(&local_418.params,&local_850.params);
      local_418.colorSpace = local_850.colorSpace;
      loc_01.filename._M_str = (char *)params.ptr;
      loc_01.filename._M_len = (size_t)params.alloc.memoryResource;
      loc_01._16_8_ = params.field_2.fixed[0];
      ShapeSceneEntity::ShapeSceneEntity
                ((ShapeSceneEntity *)local_7e8,name,&local_418,loc_01,pTVar2,objectFromRender,
                 (this->graphicsState).reverseOrientation,(this->graphicsState).currentMaterialIndex
                 ,&(this->graphicsState).currentMaterialName,local_8dc,
                 &(this->graphicsState).currentInsideMedium,
                 &(this->graphicsState).currentOutsideMedium);
      std::vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>::
      emplace_back<pbrt::ShapeSceneEntity>(this_00,(ShapeSceneEntity *)local_7e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e8._M_p != local_6d8) {
        operator_delete(local_6e8._M_p,local_6d8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_708._M_p != &local_6f8) {
        operator_delete(local_708._M_p,local_6f8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e8._184_8_ != &local_720) {
        operator_delete((void *)local_7e8._184_8_,local_720._M_allocated_capacity + 1);
      }
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::~InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                        *)(local_7e8 + 0x20));
      if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
        operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
      }
      this_01 = &local_418;
    }
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&this_01->params);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_850.params);
    return;
  }
  ErrorExit<char_const(&)[6]>
            ((FileLoc *)&params,
             "Scene description must be inside world block; \"%s\" is not allowed.",
             (char (*) [6])"Shape");
}

Assistant:

void ParsedScene::Shape(const std::string &name, ParsedParameterVector params,
                        FileLoc loc) {
    VERIFY_WORLD("Shape");

    ParameterDictionary dict(std::move(params), graphicsState.shapeAttributes,
                             graphicsState.colorSpace);

    int areaLightIndex = -1;
    if (!graphicsState.areaLightName.empty()) {
        areaLights.push_back(SceneEntity(graphicsState.areaLightName,
                                         graphicsState.areaLightParams,
                                         graphicsState.areaLightLoc));
        areaLightIndex = areaLights.size() - 1;
    }

    if (CTMIsAnimated()) {
        std::vector<AnimatedShapeSceneEntity> *as = &animatedShapes;
        if (currentInstance != nullptr) {
            if (!graphicsState.areaLightName.empty())
                Warning(&loc, "Area lights not supported with object instancing");
            as = &currentInstance->animatedShapes;
        }

        AnimatedTransform renderFromShape = RenderFromObject();
        const class Transform *identity = transformCache.Lookup(pbrt::Transform());

        as->push_back(AnimatedShapeSceneEntity(
            {name, std::move(dict), loc, renderFromShape, identity,
             graphicsState.reverseOrientation, graphicsState.currentMaterialIndex,
             graphicsState.currentMaterialName, areaLightIndex,
             graphicsState.currentInsideMedium, graphicsState.currentOutsideMedium}));
    } else {
        std::vector<ShapeSceneEntity> *s = &shapes;
        if (currentInstance != nullptr) {
            if (!graphicsState.areaLightName.empty())
                Warning(&loc, "Area lights not supported with object instancing");
            s = &currentInstance->shapes;
        }

        const class Transform *renderFromObject =
            transformCache.Lookup(RenderFromObject(0));
        const class Transform *objectFromRender =
            transformCache.Lookup(Inverse(*renderFromObject));

        s->push_back(ShapeSceneEntity(
            {name, std::move(dict), loc, renderFromObject, objectFromRender,
             graphicsState.reverseOrientation, graphicsState.currentMaterialIndex,
             graphicsState.currentMaterialName, areaLightIndex,
             graphicsState.currentInsideMedium, graphicsState.currentOutsideMedium}));
    }
}